

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_mul_mpi(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  mbedtls_mpi *X_00;
  mbedtls_mpi *X_01;
  mbedtls_mpi TB;
  mbedtls_mpi TA;
  mbedtls_mpi local_60;
  mbedtls_mpi local_48;
  
  local_48.s = 1;
  local_48.n = 0;
  local_48.p = (mbedtls_mpi_uint *)0x0;
  local_60.s = 1;
  local_60.n = 0;
  local_60.p = (mbedtls_mpi_uint *)0x0;
  X_00 = A;
  if (X == A) {
    X_00 = &local_48;
    iVar1 = mbedtls_mpi_copy(X_00,A);
    if (iVar1 != 0) goto LAB_00128fcc;
  }
  X_01 = B;
  if (X == B) {
    X_01 = &local_60;
    iVar1 = mbedtls_mpi_copy(X_01,B);
    if (iVar1 != 0) goto LAB_00128fcc;
  }
  sVar3 = X_00->n;
  if (sVar3 != 0) {
    do {
      if (X_00->p[sVar3 - 1] != 0) goto LAB_00128ee0;
      sVar3 = sVar3 - 1;
    } while (sVar3 != 0);
    sVar3 = 0;
  }
LAB_00128ee0:
  sVar4 = X_01->n;
  if (sVar4 != 0) {
    do {
      if (X_01->p[sVar4 - 1] != 0) goto LAB_00128efd;
      sVar4 = sVar4 - 1;
    } while (sVar4 != 0);
    sVar4 = 0;
  }
LAB_00128efd:
  iVar1 = mbedtls_mpi_grow(X,sVar3 + sVar4);
  if ((iVar1 == 0) && (iVar1 = mbedtls_mpi_grow(X,1), iVar1 == 0)) {
    memset(X->p,0,X->n << 3);
    *X->p = 0;
    X->s = 1;
    if (sVar4 != 0) {
      lVar2 = sVar4 * 8;
      lVar5 = -sVar4;
      do {
        lVar2 = lVar2 + -8;
        mpi_mul_hlp(sVar3,X_00->p,(mbedtls_mpi_uint *)((long)X->p + lVar2),
                    *(mbedtls_mpi_uint *)((long)X_01->p + lVar2));
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0);
    }
    X->s = X_01->s * X_00->s;
  }
LAB_00128fcc:
  if (local_60.p != (mbedtls_mpi_uint *)0x0) {
    if (local_60.n != 0) {
      sVar3 = 0;
      do {
        local_60.p[sVar3] = 0;
        sVar3 = sVar3 + 1;
      } while (local_60.n != sVar3);
    }
    free(local_60.p);
  }
  local_60.s = 1;
  local_60.n = 0;
  local_60.p = (mbedtls_mpi_uint *)0x0;
  if (local_48.p != (mbedtls_mpi_uint *)0x0) {
    if (local_48.n != 0) {
      sVar3 = 0;
      do {
        local_48.p[sVar3] = 0;
        sVar3 = sVar3 + 1;
      } while (local_48.n != sVar3);
    }
    free(local_48.p);
  }
  return iVar1;
}

Assistant:

int mbedtls_mpi_mul_mpi( mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B )
{
    int ret;
    size_t i, j;
    mbedtls_mpi TA, TB;

    mbedtls_mpi_init( &TA ); mbedtls_mpi_init( &TB );

    if( X == A ) { MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &TA, A ) ); A = &TA; }
    if( X == B ) { MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &TB, B ) ); B = &TB; }

    for( i = A->n; i > 0; i-- )
        if( A->p[i - 1] != 0 )
            break;

    for( j = B->n; j > 0; j-- )
        if( B->p[j - 1] != 0 )
            break;

    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, i + j ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( X, 0 ) );

    for( ; j > 0; j-- )
        mpi_mul_hlp( i, A->p, X->p + j - 1, B->p[j - 1] );

    X->s = A->s * B->s;

cleanup:

    mbedtls_mpi_free( &TB ); mbedtls_mpi_free( &TA );

    return( ret );
}